

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::Convert
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source,
          RelativeRoot relative,OutputFormat output)

{
  pointer pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  cmState *pcVar3;
  string result;
  string local_68;
  string local_48;
  
  pcVar1 = (source->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + source->_M_string_length);
  switch(relative) {
  case FULL:
    cmsys::SystemTools::CollapseFullPath(&local_68,&local_48);
    break;
  case HOME:
    pcVar3 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar2 = cmState::GetSourceDirectoryComponents_abi_cxx11_(pcVar3);
    ConvertToRelativePath(&local_68,this,pvVar2,&local_48,false);
    break;
  case START:
    pvVar2 = cmState::Snapshot::GetCurrentSourceDirectoryComponents_abi_cxx11_(&this->StateSnapshot)
    ;
    ConvertToRelativePath(&local_68,this,pvVar2,&local_48,false);
    break;
  case HOME_OUTPUT:
    pcVar3 = cmState::Snapshot::GetState(&this->StateSnapshot);
    pvVar2 = cmState::GetBinaryDirectoryComponents_abi_cxx11_(pcVar3);
    ConvertToRelativePath(&local_68,this,pvVar2,&local_48,false);
    break;
  case START_OUTPUT:
    pvVar2 = cmState::Snapshot::GetCurrentBinaryDirectoryComponents_abi_cxx11_(&this->StateSnapshot)
    ;
    ConvertToRelativePath(&local_68,this,pvVar2,&local_48,false);
    break;
  default:
    goto switchD_0038b8a3_default;
  }
  std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_0038b8a3_default:
  ConvertToOutputFormat(__return_storage_ptr__,this,&local_48,output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::Convert(const std::string& source,
                                       RelativeRoot relative,
                                       OutputFormat output) const
{
  // Convert the path to a relative path.
  std::string result = source;

  switch (relative)
    {
  case HOME:
    result = this->ConvertToRelativePath(
          this->GetState()->GetSourceDirectoryComponents(), result);
    break;
  case START:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetCurrentSourceDirectoryComponents(), result);
    break;
  case HOME_OUTPUT:
    result = this->ConvertToRelativePath(
          this->GetState()->GetBinaryDirectoryComponents(), result);
    break;
  case START_OUTPUT:
    result = this->ConvertToRelativePath(
          this->StateSnapshot.GetCurrentBinaryDirectoryComponents(), result);
    break;
  case FULL:
    result = cmSystemTools::CollapseFullPath(result);
    break;
  case NONE:
    break;
    }
  return this->ConvertToOutputFormat(result, output);
}